

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int element7(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  if (tok < 0x23) {
    if (tok == 0xf) {
      return 0x27;
    }
    if (tok == 0x15) {
      state->handler = element6;
      return 0x31;
    }
    if (tok != 0x18) goto switchD_00177a17_default;
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    uVar2 = *puVar1;
    iVar3 = 0x2d;
  }
  else {
    switch(tok) {
    case 0x23:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      iVar3 = 0x2f;
      break;
    case 0x24:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      iVar3 = 0x2e;
      break;
    case 0x25:
      puVar1 = &state->level;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      iVar3 = 0x30;
      break;
    case 0x26:
      state->handler = element6;
      return 0x32;
    default:
switchD_00177a17_default:
      if ((tok == 0x1c) && (state->documentEntity == 0)) {
        return 0x3b;
      }
      state->handler = error;
      return -1;
    }
  }
  if (uVar2 != 0) {
    return iVar3;
  }
  state->handler = declClose;
  state->role_none = 0x27;
  return iVar3;
}

Assistant:

static int PTRCALL
element7(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}